

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_common.cc
# Opt level: O3

void PrintConnectionInfo(BIO *bio,SSL *ssl)

{
  uint16_t uVar1;
  int iVar2;
  SSL_CIPHER *cipher;
  char *pcVar3;
  X509_NAME *pXVar4;
  char *pcVar5;
  char *pcVar6;
  UniquePtr<X509> peer;
  uint alpn_len;
  uint next_proto_len;
  size_t sct_list_len;
  uint8_t *sct_list;
  size_t ocsp_staple_len;
  uint8_t *alpn;
  uint8_t *next_proto;
  _Head_base<0UL,_x509_st_*,_false> local_68;
  uint local_60;
  uint local_5c;
  size_t local_58;
  uint8_t *local_50;
  size_t local_48;
  uint8_t *local_40;
  uchar *local_38;
  
  cipher = SSL_get_current_cipher((SSL *)ssl);
  pcVar3 = SSL_get_version((SSL *)ssl);
  BIO_printf((BIO *)bio,"  Version: %s\n",pcVar3);
  iVar2 = SSL_session_reused(ssl);
  pcVar6 = "yes";
  pcVar3 = "yes";
  if (iVar2 == 0) {
    pcVar3 = "no";
  }
  BIO_printf((BIO *)bio,"  Resumed session: %s\n",pcVar3);
  pcVar3 = SSL_CIPHER_standard_name((SSL_CIPHER *)cipher);
  BIO_printf((BIO *)bio,"  Cipher: %s\n",pcVar3);
  uVar1 = SSL_get_group_id(ssl);
  if (uVar1 != 0) {
    pcVar3 = SSL_get_group_name(uVar1);
    BIO_printf((BIO *)bio,"  ECDHE group: %s\n",pcVar3);
  }
  uVar1 = SSL_get_peer_signature_algorithm(ssl);
  if (uVar1 != 0) {
    iVar2 = SSL_version((SSL *)ssl);
    pcVar3 = SSL_get_signature_algorithm_name(uVar1,(uint)(iVar2 != 0x303));
    BIO_printf((BIO *)bio,"  Signature algorithm: %s\n",pcVar3);
  }
  iVar2 = SSL_get_secure_renegotiation_support(ssl);
  pcVar3 = "yes";
  if (iVar2 == 0) {
    pcVar3 = "no";
  }
  BIO_printf((BIO *)bio,"  Secure renegotiation: %s\n",pcVar3);
  iVar2 = SSL_get_extms_support(ssl);
  pcVar3 = "yes";
  if (iVar2 == 0) {
    pcVar3 = "no";
  }
  BIO_printf((BIO *)bio,"  Extended master secret: %s\n",pcVar3);
  SSL_get0_next_proto_negotiated((SSL *)ssl,&local_38,&local_5c);
  BIO_printf((BIO *)bio,"  Next protocol negotiated: %.*s\n",(ulong)local_5c,local_38);
  SSL_get0_alpn_selected(ssl,&local_40,&local_60);
  BIO_printf((BIO *)bio,"  ALPN protocol: %.*s\n",(ulong)local_60,local_40);
  pcVar3 = SSL_get_servername((SSL *)ssl,0);
  if (pcVar3 != (char *)0x0) {
    iVar2 = SSL_is_server(ssl);
    if (iVar2 != 0) {
      BIO_printf((BIO *)bio,"  Client sent SNI: %s\n",pcVar3);
    }
  }
  iVar2 = SSL_is_server(ssl);
  if (iVar2 == 0) {
    SSL_get0_ocsp_response(ssl,(uint8_t **)&local_68,&local_48);
    pcVar5 = "yes";
    pcVar3 = "yes";
    if (local_48 == 0) {
      pcVar3 = "no";
    }
    BIO_printf((BIO *)bio,"  OCSP staple: %s\n",pcVar3);
    SSL_get0_signed_cert_timestamp_list(ssl,&local_50,&local_58);
    if (local_58 == 0) {
      pcVar5 = "no";
    }
    BIO_printf((BIO *)bio,"  SCT list: %s\n",pcVar5);
  }
  iVar2 = SSL_early_data_accepted(ssl);
  pcVar3 = "yes";
  if (iVar2 == 0) {
    iVar2 = SSL_in_early_data(ssl);
    pcVar3 = "yes";
    if (iVar2 == 0) {
      pcVar3 = "no";
    }
  }
  BIO_printf((BIO *)bio,"  Early data: %s\n",pcVar3);
  iVar2 = SSL_ech_accepted(ssl);
  if (iVar2 == 0) {
    pcVar6 = "no";
  }
  BIO_printf((BIO *)bio,"  Encrypted ClientHello: %s\n",pcVar6);
  local_68._M_head_impl = (x509_st *)SSL_get_peer_certificate((SSL *)ssl);
  if ((X509 *)local_68._M_head_impl != (X509 *)0x0) {
    BIO_printf((BIO *)bio,"  Cert subject: ");
    pXVar4 = X509_get_subject_name((X509 *)local_68._M_head_impl);
    X509_NAME_print_ex((BIO *)bio,pXVar4,0,0x82031f);
    BIO_printf((BIO *)bio,"\n  Cert issuer: ");
    pXVar4 = X509_get_issuer_name((X509 *)local_68._M_head_impl);
    X509_NAME_print_ex((BIO *)bio,pXVar4,0,0x82031f);
    BIO_printf((BIO *)bio,"\n");
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_68);
  return;
}

Assistant:

void PrintConnectionInfo(BIO *bio, const SSL *ssl) {
  const SSL_CIPHER *cipher = SSL_get_current_cipher(ssl);

  BIO_printf(bio, "  Version: %s\n", SSL_get_version(ssl));
  BIO_printf(bio, "  Resumed session: %s\n",
             SSL_session_reused(ssl) ? "yes" : "no");
  BIO_printf(bio, "  Cipher: %s\n", SSL_CIPHER_standard_name(cipher));
  uint16_t group = SSL_get_group_id(ssl);
  if (group != 0) {
    BIO_printf(bio, "  ECDHE group: %s\n", SSL_get_group_name(group));
  }
  uint16_t sigalg = SSL_get_peer_signature_algorithm(ssl);
  if (sigalg != 0) {
    BIO_printf(bio, "  Signature algorithm: %s\n",
               SSL_get_signature_algorithm_name(
                   sigalg, SSL_version(ssl) != TLS1_2_VERSION));
  }
  BIO_printf(bio, "  Secure renegotiation: %s\n",
             SSL_get_secure_renegotiation_support(ssl) ? "yes" : "no");
  BIO_printf(bio, "  Extended master secret: %s\n",
             SSL_get_extms_support(ssl) ? "yes" : "no");

  const uint8_t *next_proto;
  unsigned next_proto_len;
  SSL_get0_next_proto_negotiated(ssl, &next_proto, &next_proto_len);
  BIO_printf(bio, "  Next protocol negotiated: %.*s\n",
             static_cast<int>(next_proto_len), next_proto);

  const uint8_t *alpn;
  unsigned alpn_len;
  SSL_get0_alpn_selected(ssl, &alpn, &alpn_len);
  BIO_printf(bio, "  ALPN protocol: %.*s\n", static_cast<int>(alpn_len), alpn);

  const char *host_name = SSL_get_servername(ssl, TLSEXT_NAMETYPE_host_name);
  if (host_name != nullptr && SSL_is_server(ssl)) {
    BIO_printf(bio, "  Client sent SNI: %s\n", host_name);
  }

  if (!SSL_is_server(ssl)) {
    const uint8_t *ocsp_staple;
    size_t ocsp_staple_len;
    SSL_get0_ocsp_response(ssl, &ocsp_staple, &ocsp_staple_len);
    BIO_printf(bio, "  OCSP staple: %s\n", ocsp_staple_len > 0 ? "yes" : "no");

    const uint8_t *sct_list;
    size_t sct_list_len;
    SSL_get0_signed_cert_timestamp_list(ssl, &sct_list, &sct_list_len);
    BIO_printf(bio, "  SCT list: %s\n", sct_list_len > 0 ? "yes" : "no");
  }

  BIO_printf(
      bio, "  Early data: %s\n",
      (SSL_early_data_accepted(ssl) || SSL_in_early_data(ssl)) ? "yes" : "no");

  BIO_printf(bio, "  Encrypted ClientHello: %s\n",
             SSL_ech_accepted(ssl) ? "yes" : "no");

  // Print the server cert subject and issuer names.
  bssl::UniquePtr<X509> peer(SSL_get_peer_certificate(ssl));
  if (peer != nullptr) {
    BIO_printf(bio, "  Cert subject: ");
    X509_NAME_print_ex(bio, X509_get_subject_name(peer.get()), 0,
                       XN_FLAG_ONELINE);
    BIO_printf(bio, "\n  Cert issuer: ");
    X509_NAME_print_ex(bio, X509_get_issuer_name(peer.get()), 0,
                       XN_FLAG_ONELINE);
    BIO_printf(bio, "\n");
  }
}